

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  string_view prefix;
  string_view str;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  unsigned_long uVar4;
  bool local_1aa;
  allocator<char> local_149;
  string local_148 [8];
  string sfname;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uint local_b4;
  Status SStack_b0;
  uint i;
  Directory local_a8;
  Directory d;
  string local_98 [7];
  bool res;
  undefined1 local_68 [8];
  string ppath;
  string path;
  int type_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *glob_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(files);
  pcVar2 = (char *)std::__cxx11::string::back();
  if (*pcVar2 == '*') {
    cmsys::SystemTools::GetFilenamePath((string *)((long)&ppath.field_2 + 8),glob);
    cmsys::SystemTools::GetFilenameName((string *)local_68,glob);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_68);
    std::__cxx11::string::operator=((string *)local_68,local_98);
    std::__cxx11::string::~string(local_98);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(ppath.field_2._M_local_buf + 8),"/");
    }
    d.Internal._7_1_ = 0;
    cmsys::Directory::Directory(&local_a8);
    SStack_b0 = cmsys::Directory::Load(&local_a8,(string *)((long)&ppath.field_2 + 8),(string *)0x0)
    ;
    bVar1 = cmsys::Status::operator_cast_to_bool(&stack0xffffffffffffff50);
    if (bVar1) {
      for (local_b4 = 0; uVar3 = (ulong)local_b4,
          uVar4 = cmsys::Directory::GetNumberOfFiles(&local_a8), uVar3 < uVar4;
          local_b4 = local_b4 + 1) {
        fname.field_2._M_local_buf[0xe] = '\0';
        fname.field_2._M_local_buf[0xd] = '\0';
        pcVar2 = cmsys::Directory::GetFile(&local_a8,(ulong)local_b4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar2,&local_d9);
        bVar1 = std::operator!=(&local_d8,".");
        local_1aa = false;
        if (bVar1) {
          pcVar2 = cmsys::Directory::GetFile(&local_a8,(ulong)local_b4);
          std::allocator<char>::allocator();
          fname.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,pcVar2,
                     (allocator<char> *)(fname.field_2._M_local_buf + 0xf));
          fname.field_2._M_local_buf[0xd] = '\x01';
          local_1aa = std::operator!=(&local_100,"..");
        }
        if ((fname.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_100);
        }
        if ((fname.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
        }
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator(&local_d9);
        if (local_1aa != false) {
          std::__cxx11::string::string
                    ((string *)(sfname.field_2._M_local_buf + 8),
                     (string *)(ppath.field_2._M_local_buf + 8));
          pcVar2 = (char *)std::__cxx11::string::back();
          if (*pcVar2 != '/') {
            std::__cxx11::string::operator+=((string *)(sfname.field_2._M_local_buf + 8),"/");
          }
          pcVar2 = cmsys::Directory::GetFile(&local_a8,(ulong)local_b4);
          std::__cxx11::string::operator+=((string *)(sfname.field_2._M_local_buf + 8),pcVar2);
          pcVar2 = cmsys::Directory::GetFile(&local_a8,(ulong)local_b4);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_148,pcVar2,&local_149);
          std::allocator<char>::~allocator(&local_149);
          if (((type < 1) ||
              (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&sfname.field_2 + 8)),
              !bVar1)) &&
             ((-1 < type ||
              (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&sfname.field_2 + 8)),
              bVar1)))) {
            str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_148);
            prefix = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
            bVar1 = cmHasPrefix(str,prefix);
            if (bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(files,(value_type *)((long)&sfname.field_2 + 8));
              d.Internal._7_1_ = 1;
            }
          }
          std::__cxx11::string::~string(local_148);
          std::__cxx11::string::~string((string *)(sfname.field_2._M_local_buf + 8));
        }
      }
    }
    glob_local._7_1_ = (bool)(d.Internal._7_1_ & 1);
    cmsys::Directory::~Directory(&local_a8);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(ppath.field_2._M_local_buf + 8));
  }
  else {
    glob_local._7_1_ = false;
  }
  return glob_local._7_1_;
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if (glob.back() != '*') {
    return false;
  }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size() - 1);
  if (path.empty()) {
    path = "/";
  }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = path;
        if (path.back() != '/') {
          fname += "/";
        }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if (type > 0 && cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (type < 0 && !cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (cmHasPrefix(sfname, ppath)) {
          files.push_back(fname);
          res = true;
        }
      }
    }
  }
  return res;
}